

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

Gia_Man_t * Jf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  Vec_Mem_t *p;
  char *pcVar2;
  Jf_Man_t *p_00;
  FILE *__stream;
  word *pwVar3;
  code *pcVar4;
  char *pcVar5;
  uint uVar6;
  Jf_Par_t *pJVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  char local_418 [1000];
  
  if (pGia->nBufs != 0) {
    __assert_fail("!Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0x6b5,"Gia_Man_t *Jf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fGenCnf == 0) goto LAB_0058f994;
  }
  else {
    if ((pPars->fFuncDsd != 0) && (6 < pPars->nLutSize)) {
      __assert_fail("!pPars->fCutMin || !pPars->fFuncDsd || pPars->nLutSize <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                    ,0x6b6,"Gia_Man_t *Jf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
    }
    if (pPars->fGenCnf == 0) {
      if ((pPars->fCutMin != 0) && (pPars->fFuncDsd == 0)) {
        pPars->fCoarsen = 0;
      }
      goto LAB_0058f994;
    }
  }
  pPars->fCutMin = 1;
  pPars->fFuncDsd = 1;
  pPars->fOptEdge = 0;
LAB_0058f994:
  p_00 = Jf_ManAlloc(pGia,pPars);
  pcVar4 = Jf_CutCompareArea;
  if (pPars->fAreaOnly == 0) {
    pcVar4 = Jf_CutCompareDelay;
  }
  p_00->pCutCmp = pcVar4;
  Jf_ManComputeCuts(p_00,0);
  Jf_ManComputeRefs(p_00);
  Jf_ManPrintStats(p_00,"Start");
  pJVar7 = p_00->pPars;
  for (iVar9 = 0; iVar9 < pPars->nRounds; iVar9 = iVar9 + 1) {
    if (pJVar7->fGenCnf == 0) {
      Jf_ManPropagateFlow(p_00,pPars->fOptEdge);
      Jf_ManPrintStats(p_00,"Flow ");
    }
    Jf_ManPropagateEla(p_00,0);
    Jf_ManPrintStats(p_00,"Area ");
    Jf_ManPropagateEla(p_00,1);
    Jf_ManPrintStats(p_00,"Edge ");
  }
  if (((pJVar7->fVeryVerbose != 0) && (pJVar7->fCutMin != 0)) && (pJVar7->fFuncDsd == 0)) {
    p = p_00->vTtMem;
    pcVar2 = p_00->pGia->pName;
    uVar1 = pJVar7->nLutSize;
    sprintf(local_418,"tt_%s_%02d.txt",pcVar2,(ulong)uVar1);
    __stream = _stdout;
    if ((pcVar2 == (char *)0x0) || (__stream = fopen(local_418,"wb"), _stdout == __stream)) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)p->nEntries);
    }
    iVar9 = 0;
    while ((iVar9 < p->nEntries && (pwVar3 = Vec_MemReadEntry(p,iVar9), pwVar3 != (word *)0x0))) {
      uVar11 = (ulong)(uint)p->nEntrySize;
      while (0 < (int)uVar11) {
        uVar11 = uVar11 - 1;
        bVar8 = 0x3c;
        for (iVar10 = 0xf; -1 < iVar10; iVar10 = iVar10 + -1) {
          uVar6 = (uint)(pwVar3[uVar11] >> (bVar8 & 0x3f)) & 0xf;
          if (uVar6 < 10) {
            fprintf(__stream,"%d");
          }
          else {
            fputc(uVar6 + 0x37,__stream);
          }
          bVar8 = bVar8 - 4;
        }
      }
      fputc(10,__stream);
      iVar9 = iVar9 + 1;
    }
    if (__stream != _stdout) {
      fclose(__stream);
    }
    pcVar5 = local_418;
    if (pcVar2 == (char *)0x0) {
      pcVar5 = "stdout";
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)p->nEntrySize * (double)p->nEntries * 8.0 * 9.5367431640625e-07,
           (ulong)(uint)p->nEntries,(ulong)uVar1,pcVar5);
    pJVar7 = p_00->pPars;
  }
  if (pJVar7->fPureAig == 0) {
    if (pJVar7->fCutMin == 0) {
      Jf_ManDeriveMapping(p_00);
    }
    else {
      pGia = Jf_ManDeriveMappingGia(p_00);
    }
  }
  else {
    pGia = Jf_ManDeriveGia(p_00);
  }
  Jf_ManFree(p_00);
  return pGia;
}

Assistant:

Gia_Man_t * Jf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = pGia;
    Jf_Man_t * p; int i;
    assert( !Gia_ManBufNum(pGia) );
    assert( !pPars->fCutMin || !pPars->fFuncDsd || pPars->nLutSize <= 6 );
    if ( pPars->fGenCnf )
        pPars->fCutMin = 1, pPars->fFuncDsd = 1, pPars->fOptEdge = 0;
    if ( pPars->fCutMin && !pPars->fFuncDsd )
        pPars->fCoarsen = 0;
    p = Jf_ManAlloc( pGia, pPars );
    p->pCutCmp = pPars->fAreaOnly ? Jf_CutCompareArea : Jf_CutCompareDelay;
    Jf_ManComputeCuts( p, 0 );
    Jf_ManComputeRefs( p );                         Jf_ManPrintStats( p, "Start" );
    for ( i = 0; i < pPars->nRounds; i++ )
    {
        if ( !p->pPars->fGenCnf )
        {
        Jf_ManPropagateFlow( p, pPars->fOptEdge );  Jf_ManPrintStats( p, "Flow " );
        }
        Jf_ManPropagateEla( p, 0 );                 Jf_ManPrintStats( p, "Area " );
        Jf_ManPropagateEla( p, 1 );                 Jf_ManPrintStats( p, "Edge " );
    }
    if ( p->pPars->fVeryVerbose && p->pPars->fCutMin && !p->pPars->fFuncDsd )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), p->pPars->nLutSize );
    if ( p->pPars->fPureAig )
        pNew = Jf_ManDeriveGia(p);
    else if ( p->pPars->fCutMin )
        pNew = Jf_ManDeriveMappingGia(p);
    else
        Jf_ManDeriveMapping(p);
    Jf_ManFree( p );
    return pNew;
}